

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

opj_pi_iterator_t * pi_create_decode_v2(opj_image_t *p_image,opj_cp_v2_t *p_cp,OPJ_UINT32 p_tile_no)

{
  uint uVar1;
  uint uVar2;
  opj_tcp_v2_t *poVar3;
  opj_pi_resolution_t *poVar4;
  OPJ_UINT32 *pOVar5;
  OPJ_UINT32 **__ptr;
  OPJ_UINT32 **p_resolutions;
  opj_pi_iterator_t *p_pi;
  short *psVar6;
  opj_image_comp_t *poVar7;
  OPJ_UINT32 OVar8;
  ulong uVar9;
  opj_pi_iterator_t *poVar10;
  OPJ_UINT32 **ppOVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  opj_pi_comp_t *poVar16;
  opj_pi_iterator_t *poVar17;
  int iVar18;
  bool bVar19;
  OPJ_INT32 l_ty1;
  OPJ_INT32 l_ty0;
  OPJ_INT32 l_tx1;
  OPJ_INT32 l_tx0;
  opj_image_comp_t *local_48;
  OPJ_UINT32 l_dy_min;
  OPJ_UINT32 l_dx_min;
  OPJ_UINT32 l_max_prec;
  OPJ_UINT32 l_max_res;
  
  poVar3 = p_cp->tcps;
  OVar8 = poVar3[p_tile_no].numpocs;
  uVar1 = p_image->numcomps;
  __ptr = (OPJ_UINT32 **)malloc((ulong)(uVar1 * 0x84) << 2);
  if (__ptr != (OPJ_UINT32 **)0x0) {
    p_resolutions = (OPJ_UINT32 **)malloc((ulong)uVar1 << 3);
    if (p_resolutions != (OPJ_UINT32 **)0x0) {
      p_pi = pi_create(p_image,p_cp,p_tile_no);
      if (p_pi != (opj_pi_iterator_t *)0x0) {
        poVar3 = poVar3 + p_tile_no;
        uVar1 = OVar8 + 1;
        uVar15 = p_image->numcomps;
        ppOVar11 = __ptr;
        for (uVar9 = 0; uVar15 != uVar9; uVar9 = uVar9 + 1) {
          p_resolutions[uVar9] = (OPJ_UINT32 *)ppOVar11;
          ppOVar11 = ppOVar11 + 0x42;
        }
        get_all_encoding_parameters
                  (p_image,p_cp,p_tile_no,&l_tx0,&l_tx1,&l_ty0,&l_ty1,&l_dx_min,&l_dy_min,
                   &l_max_prec,&l_max_res,p_resolutions);
        iVar18 = p_image->numcomps * l_max_prec;
        iVar13 = l_max_res * iVar18;
        psVar6 = (short *)calloc((ulong)((poVar3->numlayers + 1) * iVar13),2);
        p_pi->include = psVar6;
        if (psVar6 == (short *)0x0) {
          free(__ptr);
          free(p_resolutions);
          pi_destroy_v2(p_pi,uVar1);
          return (opj_pi_iterator_t *)0x0;
        }
        poVar16 = p_pi->comps;
        local_48 = p_image->comps;
        p_pi->tx0 = l_tx0;
        p_pi->ty0 = l_ty0;
        p_pi->tx1 = l_tx1;
        p_pi->ty1 = l_ty1;
        p_pi->step_p = 1;
        p_pi->step_c = l_max_prec;
        p_pi->step_r = iVar18;
        p_pi->step_l = iVar13;
        uVar15 = p_pi->numcomps;
        poVar10 = p_pi;
        poVar7 = local_48;
        for (uVar9 = 0; uVar9 != uVar15; uVar9 = uVar9 + 1) {
          poVar4 = poVar16->resolutions;
          poVar10 = (opj_pi_iterator_t *)p_resolutions[uVar9];
          OVar8 = poVar7->dy;
          poVar16->dx = poVar7->dx;
          poVar16->dy = OVar8;
          iVar14 = poVar16->numresolutions;
          lVar12 = 0;
          while (bVar19 = iVar14 != 0, iVar14 = iVar14 + -1, bVar19) {
            *(undefined4 *)((long)&poVar4->pdx + lVar12) =
                 *(undefined4 *)((poVar10->poc).progorder + lVar12 + -0x5c);
            *(undefined4 *)((long)&poVar4->pdy + lVar12) =
                 *(undefined4 *)((poVar10->poc).progorder + lVar12 + -0x58);
            *(undefined4 *)((long)&poVar4->pw + lVar12) =
                 *(undefined4 *)((poVar10->poc).progorder + lVar12 + -0x54);
            *(undefined4 *)((long)&poVar4->ph + lVar12) =
                 *(undefined4 *)((poVar10->poc).progorder + lVar12 + -0x50);
            lVar12 = lVar12 + 0x10;
          }
          poVar16 = poVar16 + 1;
          poVar7 = poVar7 + 1;
        }
        poVar17 = p_pi;
        for (uVar15 = 1; OVar8 = (OPJ_UINT32)poVar10, uVar15 < uVar1; uVar15 = uVar15 + 1) {
          poVar16 = poVar17[1].comps;
          poVar17[1].tx0 = l_tx0;
          poVar17[1].ty0 = l_ty0;
          poVar17[1].tx1 = l_tx1;
          poVar17[1].ty1 = l_ty1;
          poVar17[1].step_p = 1;
          poVar17[1].step_c = l_max_prec;
          poVar17[1].step_r = iVar18;
          poVar17[1].step_l = iVar13;
          uVar2 = poVar17[1].numcomps;
          poVar7 = local_48;
          for (uVar9 = 0; uVar9 != uVar2; uVar9 = uVar9 + 1) {
            poVar10 = (opj_pi_iterator_t *)poVar16->resolutions;
            pOVar5 = p_resolutions[uVar9];
            OVar8 = poVar7->dy;
            poVar16->dx = poVar7->dx;
            poVar16->dy = OVar8;
            iVar14 = poVar16->numresolutions;
            lVar12 = 0;
            while (bVar19 = iVar14 != 0, iVar14 = iVar14 + -1, bVar19) {
              *(undefined4 *)((poVar10->poc).progorder + lVar12 + -0x5c) =
                   *(undefined4 *)((long)pOVar5 + lVar12);
              *(undefined4 *)((poVar10->poc).progorder + lVar12 + -0x58) =
                   *(undefined4 *)((long)pOVar5 + lVar12 + 4);
              *(undefined4 *)((poVar10->poc).progorder + lVar12 + -0x54) =
                   *(undefined4 *)((long)pOVar5 + lVar12 + 8);
              *(undefined4 *)((poVar10->poc).progorder + lVar12 + -0x50) =
                   *(undefined4 *)((long)pOVar5 + lVar12 + 0xc);
              lVar12 = lVar12 + 0x10;
            }
            poVar16 = poVar16 + 1;
            poVar7 = poVar7 + 1;
          }
          poVar17[1].include = poVar17->include;
          poVar17 = poVar17 + 1;
        }
        free(__ptr);
        free(p_resolutions);
        if ((poVar3->field_0x1628 & 2) != 0) {
          pi_update_decode_poc(p_pi,poVar3,l_max_prec,OVar8);
          return p_pi;
        }
        pi_update_decode_not_poc(p_pi,poVar3,l_max_prec,l_max_res);
        return p_pi;
      }
      free(__ptr);
      __ptr = p_resolutions;
    }
    free(__ptr);
  }
  return (opj_pi_iterator_t *)0x0;
}

Assistant:

opj_pi_iterator_t *pi_create_decode_v2(	opj_image_t *p_image,
										opj_cp_v2_t *p_cp,
										OPJ_UINT32 p_tile_no
										)
{
	// loop
	OPJ_UINT32 pino;
	OPJ_UINT32 compno, resno;

	// to store w, h, dx and dy fro all components and resolutions
	OPJ_UINT32 * l_tmp_data;
	OPJ_UINT32 ** l_tmp_ptr;

	// encoding prameters to set
	OPJ_UINT32 l_max_res;
	OPJ_UINT32 l_max_prec;
	OPJ_INT32 l_tx0,l_tx1,l_ty0,l_ty1;
	OPJ_UINT32 l_dx_min,l_dy_min;
	OPJ_UINT32 l_bound;
	OPJ_UINT32 l_step_p , l_step_c , l_step_r , l_step_l ;
	OPJ_UINT32 l_data_stride;

	// pointers
	opj_pi_iterator_t *l_pi = 00;
	opj_tcp_v2_t *l_tcp = 00;
	const opj_tccp_t *l_tccp = 00;
	opj_pi_comp_t *l_current_comp = 00;
	opj_image_comp_t * l_img_comp = 00;
	opj_pi_iterator_t * l_current_pi = 00;
	OPJ_UINT32 * l_encoding_value_ptr = 00;

	// preconditions in debug
	assert(p_cp != 00);
	assert(p_image != 00);
	assert(p_tile_no < p_cp->tw * p_cp->th);

	// initializations
	l_tcp = &p_cp->tcps[p_tile_no];
	l_bound = l_tcp->numpocs+1;

	l_data_stride = 4 * J2K_MAXRLVLS;
	l_tmp_data = (OPJ_UINT32*)opj_malloc(
		l_data_stride * p_image->numcomps * sizeof(OPJ_UINT32));
	if
		(! l_tmp_data)
	{
		return 00;
	}
	l_tmp_ptr = (OPJ_UINT32**)opj_malloc(
		p_image->numcomps * sizeof(OPJ_UINT32 *));
	if
		(! l_tmp_ptr)
	{
		opj_free(l_tmp_data);
		return 00;
	}

	// memory allocation for pi
	l_pi = pi_create(p_image, p_cp, p_tile_no);
	if (!l_pi) {
		opj_free(l_tmp_data);
		opj_free(l_tmp_ptr);
		return 00;
	}

	l_encoding_value_ptr = l_tmp_data;
	// update pointer array
	for
		(compno = 0; compno < p_image->numcomps; ++compno)
	{
		l_tmp_ptr[compno] = l_encoding_value_ptr;
		l_encoding_value_ptr += l_data_stride;
	}
	// get encoding parameters
	get_all_encoding_parameters(p_image,p_cp,p_tile_no,&l_tx0,&l_tx1,&l_ty0,&l_ty1,&l_dx_min,&l_dy_min,&l_max_prec,&l_max_res,l_tmp_ptr);

	// step calculations
	l_step_p = 1;
	l_step_c = l_max_prec * l_step_p;
	l_step_r = p_image->numcomps * l_step_c;
	l_step_l = l_max_res * l_step_r;

	// set values for first packet iterator
	l_current_pi = l_pi;

	// memory allocation for include
	l_current_pi->include = (OPJ_INT16*) opj_calloc((l_tcp->numlayers +1) * l_step_l, sizeof(OPJ_INT16));
	if
		(!l_current_pi->include)
	{
		opj_free(l_tmp_data);
		opj_free(l_tmp_ptr);
		pi_destroy_v2(l_pi, l_bound);
		return 00;
	}
	memset(l_current_pi->include,0, (l_tcp->numlayers + 1) * l_step_l* sizeof(OPJ_INT16));

	// special treatment for the first packet iterator
	l_current_comp = l_current_pi->comps;
	l_img_comp = p_image->comps;
	l_tccp = l_tcp->tccps;

	l_current_pi->tx0 = l_tx0;
	l_current_pi->ty0 = l_ty0;
	l_current_pi->tx1 = l_tx1;
	l_current_pi->ty1 = l_ty1;

	//l_current_pi->dx = l_img_comp->dx;
	//l_current_pi->dy = l_img_comp->dy;

	l_current_pi->step_p = l_step_p;
	l_current_pi->step_c = l_step_c;
	l_current_pi->step_r = l_step_r;
	l_current_pi->step_l = l_step_l;

	/* allocation for components and number of components has already been calculated by pi_create */
	for
		(compno = 0; compno < l_current_pi->numcomps; ++compno)
	{
		opj_pi_resolution_t *l_res = l_current_comp->resolutions;
		l_encoding_value_ptr = l_tmp_ptr[compno];

		l_current_comp->dx = l_img_comp->dx;
		l_current_comp->dy = l_img_comp->dy;
		/* resolutions have already been initialized */
		for
			(resno = 0; resno < l_current_comp->numresolutions; resno++)
		{
			l_res->pdx = *(l_encoding_value_ptr++);
			l_res->pdy = *(l_encoding_value_ptr++);
			l_res->pw =  *(l_encoding_value_ptr++);
			l_res->ph =  *(l_encoding_value_ptr++);
			++l_res;
		}
		++l_current_comp;
		++l_img_comp;
		++l_tccp;
	}
	++l_current_pi;

	for
		(pino = 1 ; pino<l_bound ; ++pino )
	{
		opj_pi_comp_t *l_current_comp = l_current_pi->comps;
		opj_image_comp_t * l_img_comp = p_image->comps;
		l_tccp = l_tcp->tccps;

		l_current_pi->tx0 = l_tx0;
		l_current_pi->ty0 = l_ty0;
		l_current_pi->tx1 = l_tx1;
		l_current_pi->ty1 = l_ty1;
		//l_current_pi->dx = l_dx_min;
		//l_current_pi->dy = l_dy_min;
		l_current_pi->step_p = l_step_p;
		l_current_pi->step_c = l_step_c;
		l_current_pi->step_r = l_step_r;
		l_current_pi->step_l = l_step_l;

		/* allocation for components and number of components has already been calculated by pi_create */
		for
			(compno = 0; compno < l_current_pi->numcomps; ++compno)
		{
			opj_pi_resolution_t *l_res = l_current_comp->resolutions;
			l_encoding_value_ptr = l_tmp_ptr[compno];

			l_current_comp->dx = l_img_comp->dx;
			l_current_comp->dy = l_img_comp->dy;
			/* resolutions have already been initialized */
			for
				(resno = 0; resno < l_current_comp->numresolutions; resno++)
			{
				l_res->pdx = *(l_encoding_value_ptr++);
				l_res->pdy = *(l_encoding_value_ptr++);
				l_res->pw =  *(l_encoding_value_ptr++);
				l_res->ph =  *(l_encoding_value_ptr++);
				++l_res;
			}
			++l_current_comp;
			++l_img_comp;
			++l_tccp;
		}
		// special treatment
		l_current_pi->include = (l_current_pi-1)->include;
		++l_current_pi;
	}
	opj_free(l_tmp_data);
	l_tmp_data = 00;
	opj_free(l_tmp_ptr);
	l_tmp_ptr = 00;
	if
		(l_tcp->POC)
	{
		pi_update_decode_poc (l_pi,l_tcp,l_max_prec,l_max_res);
	}
	else
	{
		pi_update_decode_not_poc(l_pi,l_tcp,l_max_prec,l_max_res);
	}
	return l_pi;
}